

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem-disk-unix.c++
# Opt level: O3

void __thiscall kj::anon_unknown_8::DiskHandle::sync(DiskHandle *this)

{
  int iVar1;
  Fault f;
  Fault local_20;
  undefined8 local_18;
  undefined8 uStack_10;
  
  do {
    iVar1 = fsync((this->fd).fd);
    if (-1 < iVar1) {
      return;
    }
    iVar1 = _::Debug::getOsErrorNumber(false);
  } while (iVar1 == -1);
  if (iVar1 == 0) {
    return;
  }
  local_20.exception = (Exception *)0x0;
  local_18 = 0;
  uStack_10 = 0;
  _::Debug::Fault::init
            (&local_20,
             (EVP_PKEY_CTX *)
             "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/filesystem-disk-unix.c++"
            );
  _::Debug::Fault::fatal(&local_20);
}

Assistant:

void sync() const {
#if __APPLE__
    // For whatever reason, fsync() on OSX only flushes kernel buffers. It does not flush hardware
    // disk buffers. This makes it not very useful. But OSX documents fcntl F_FULLFSYNC which does
    // the right thing. Why they don't just make fsync() do the right thing, I do not know.
    KJ_SYSCALL(fcntl(fd, F_FULLFSYNC));
#else
    KJ_SYSCALL(fsync(fd));
#endif
  }